

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void SlowSort(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  long lVar1;
  array *paVar2;
  void *pvVar3;
  arraycmp p_Var4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 *__dest;
  char *pcVar8;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  char *local_60;
  bool_t local_58;
  array *local_50;
  void *local_48;
  arraycmp local_40;
  char *local_38;
  
  lVar1 = -(Width + 0xf & 0xfffffffffffffff0);
  __dest = auStack_68 + lVar1;
  local_58 = Unique;
  local_48 = CmpParam;
  local_40 = Cmp;
  if (p == (array *)0x0) {
    *(code **)((long)&uStack_70 + lVar1) = ArrayFindEx;
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x161,"void SlowSort(array *, size_t, size_t, arraycmp, const void *, bool_t)");
  }
  pcVar7 = p->_Begin;
  local_38 = pcVar7 + Count * Width;
  local_50 = p;
  if (Count * Width - Width != 0) {
    pcVar6 = pcVar7 + Width;
    do {
      p_Var4 = local_40;
      pvVar3 = local_48;
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107ace;
      iVar5 = (*p_Var4)(pvVar3,pcVar6,pcVar7);
      pcVar8 = pcVar6;
      if (iVar5 < 0) {
        local_60 = pcVar6;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107ae4;
        memcpy(__dest,pcVar6,Width);
        do {
          pcVar6 = pcVar7;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107af6;
          memcpy(pcVar6 + Width,pcVar6,Width);
          p_Var4 = local_40;
          pvVar3 = local_48;
          if (pcVar6 == local_50->_Begin) break;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107b10;
          iVar5 = (*p_Var4)(pvVar3,__dest,pcVar6 + -Width);
          pcVar7 = pcVar6 + -Width;
        } while (iVar5 < 0);
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107b22;
        memcpy(pcVar6,__dest,Width);
        pcVar8 = local_60;
      }
      pcVar6 = pcVar8 + Width;
      pcVar7 = pcVar8;
    } while (pcVar6 != local_38);
  }
  paVar2 = local_50;
  if (local_58 != 0) {
    pcVar6 = local_50->_Begin;
    pcVar7 = pcVar6 + Width;
    pcVar8 = pcVar6;
    if (pcVar7 != local_38) {
      do {
        p_Var4 = local_40;
        pvVar3 = local_48;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107b58;
        iVar5 = (*p_Var4)(pvVar3,pcVar7,pcVar8);
        if (iVar5 != 0) {
          pcVar8 = pcVar8 + Width;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x107b6d;
          memcpy(pcVar8,pcVar7,Width);
        }
        pcVar7 = pcVar7 + Width;
      } while (pcVar7 != local_38);
      pcVar6 = paVar2->_Begin;
    }
    paVar2->_Used = (size_t)(pcVar8 + (Width - (long)pcVar6));
  }
  return;
}

Assistant:

static void SlowSort(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
#if defined(_MSC_VER) && !defined (__clang__)
    uint8_t* Tmp = (uint8_t*)_alloca(Width);
#else
    uint8_t Tmp[Width];
#endif
    char* End = ARRAYBEGIN(*p,char) + Count*Width;
    char* i;
    char* j;

    j = p->_Begin;
    for (i=j+Width; i!=End; i+=Width)
    {
        if (Cmp(CmpParam,i,j) < 0)
        {
            memcpy(Tmp,i,Width);
            do
            {
                memcpy(j+Width,j,Width);
                if (j == p->_Begin)
                {
                    j -= Width;
                    break;
                }
                j -= Width;
            }
            while (Cmp(CmpParam,Tmp,j) < 0);
            memcpy(j+Width,Tmp,Width);
        }
        j = i;
    }

    if (Unique)
    {
        j = p->_Begin;
        for (i=j+Width; i!=End; i+=Width)
        {
            if (Cmp(CmpParam,i,j) != 0)
            {
                j += Width;
                memcpy(j,i,Width);
            }
        }
        p->_Used = j - p->_Begin + Width;
    }
}